

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O0

void __thiscall
boost::runtime::option::
option<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>
          (option *this,cstring *name,
          named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>
          *m)

{
  basic_cstring<const_char> *in_RSI;
  undefined8 *in_RDI;
  named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_bool_&>
  *np;
  keyword<boost::runtime::(anonymous_namespace)::optional_value_t,_false> *in_stack_fffffffffffffe08
  ;
  named_parameter_combine<boost::nfp::named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::default_value_t,_const_bool_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_bool_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>_>
  *m_00;
  argument_factory<bool,_false,_false> *this_00;
  argument_factory<bool,_false,_false> local_e0 [7];
  undefined1 local_c9;
  named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_bool_&>
  local_c8;
  named_parameter_combine<boost::nfp::named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::default_value_t,_const_bool_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_bool_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>_>
  local_b8;
  named_parameter_combine<boost::nfp::named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::default_value_t,_const_bool_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_bool_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>_>
  *in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffd6;
  undefined1 in_stack_ffffffffffffffd7;
  cstring *in_stack_ffffffffffffffd8;
  basic_param *in_stack_ffffffffffffffe0;
  
  unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)&stack0xffffffffffffffd8,in_RSI);
  local_c9 = 1;
  np = &local_c8;
  nfp::keyword<boost::runtime::(anonymous_namespace)::optional_value_t,false>::operator=
            (in_stack_fffffffffffffe08,(bool *)np);
  m_00 = &local_b8;
  nfp::
  opt_append<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>,boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::optional_value_t,bool_const&>>
            ((named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>
              *)m_00,np);
  this_00 = local_e0;
  nfp::keyword<boost::runtime::(anonymous_namespace)::default_value_t,false>::operator=
            ((keyword<boost::runtime::(anonymous_namespace)::default_value_t,_false> *)m_00,
             (bool *)np);
  nfp::
  opt_append<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::optional_value_t,bool_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>,boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::default_value_t,bool_const&>>
            (&m_00->
              super_named_parameter_combine<boost::nfp::named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_bool_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
             ,(named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::default_value_t,_const_bool_&>
               *)np);
  basic_param::
  basic_param<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::default_value_t,bool_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::optional_value_t,bool_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(bool)in_stack_ffffffffffffffd7,
             (bool)in_stack_ffffffffffffffd6,in_stack_ffffffffffffffc8);
  *in_RDI = &PTR__option_00302bf0;
  nfp::keyword<boost::runtime::(anonymous_namespace)::optional_value_t,false>::operator=
            ((keyword<boost::runtime::(anonymous_namespace)::optional_value_t,_false> *)m_00,
             (bool *)np);
  nfp::
  opt_append<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>,boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::optional_value_t,bool_const&>>
            ((named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>
              *)m_00,np);
  nfp::keyword<boost::runtime::(anonymous_namespace)::default_value_t,false>::operator=
            ((keyword<boost::runtime::(anonymous_namespace)::default_value_t,_false> *)m_00,
             (bool *)np);
  nfp::
  opt_append<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::optional_value_t,bool_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>,boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::default_value_t,bool_const&>>
            (&m_00->
              super_named_parameter_combine<boost::nfp::named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::optional_value_t,_const_bool_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
             ,(named_parameter<const_bool,_boost::runtime::(anonymous_namespace)::default_value_t,_const_bool_&>
               *)np);
  argument_factory<bool,false,false>::
  argument_factory<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::default_value_t,bool_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<bool_const,boost::runtime::(anonymous_namespace)::optional_value_t,bool_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>>>
            (this_00,m_00);
  return;
}

Assistant:

option( cstring name, Modifiers const& m )
#endif
    : basic_param( name, true, false, nfp::opt_append( nfp::opt_append( m, optional_value = true), default_value = false) )
    , m_arg_factory( nfp::opt_append( nfp::opt_append( m, optional_value = true), default_value = false) )
    {
    }